

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::insert
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos,
          Constructable *val)

{
  int iVar1;
  size_type sVar2;
  pointer pCVar3;
  undefined8 in_RAX;
  pointer pCVar4;
  long lVar5;
  ulong uVar6;
  Constructable *src;
  Constructable temp;
  Constructable local_28;
  
  sVar2 = this->len;
  if (sVar2 == this->cap) {
    pCVar4 = emplaceRealloc<(anonymous_namespace)::Constructable_const&>(this,pos,val);
    return pCVar4;
  }
  pCVar3 = this->data_;
  pCVar4 = pCVar3 + sVar2;
  if ((long)pCVar4 - (long)pos == 0) {
    iVar1 = val->value;
    pCVar4->constructed = true;
    pCVar4->value = iVar1;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
    this->len = sVar2 + 1;
  }
  else {
    local_28._1_7_ = SUB87((ulong)in_RAX >> 8,0);
    local_28.constructed = true;
    local_28.value = val->value;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
    pCVar4->constructed = true;
    pCVar4->value = pCVar4[-1].value;
    pCVar4[-1].value = 0;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 2;
    (anonymous_namespace)::Constructable::numMoveConstructorCalls =
         (anonymous_namespace)::Constructable::numMoveConstructorCalls + 1;
    lVar5 = ((long)pCVar4 - (long)pos) + -8 >> 3;
    if (0 < lVar5) {
      uVar6 = lVar5 + 1;
      src = pCVar3 + (sVar2 - 2);
      do {
        anon_unknown.dwarf_d691dd::Constructable::operator=(src + 1,src);
        uVar6 = uVar6 - 1;
        src = src + -1;
      } while (1 < uVar6);
    }
    anon_unknown.dwarf_d691dd::Constructable::operator=(pos,&local_28);
    this->len = this->len + 1;
    anon_unknown.dwarf_d691dd::Constructable::~Constructable(&local_28);
  }
  return pos;
}

Assistant:

iterator insert(const_iterator pos, const T& val) { return emplace(pos, val); }